

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<8,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  int col;
  undefined4 uVar8;
  Type in0;
  int local_28 [7];
  float afStack_c [3];
  
  pfVar2 = (float *)&in0;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar8;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x24);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    in0.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    in0.m_data.m_data[1].m_data[0] = (float)uVar1;
    in0.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
    in0.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    in0.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[2] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[2] = 0.0;
    puVar4 = &s_constInMat3x3;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pfVar7 = pfVar2;
      do {
        *pfVar7 = (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pfVar7 = pfVar7 + 3;
      } while (lVar5 != 3);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 3);
  }
  lVar3 = 0;
  do {
    afStack_c[lVar3] =
         (((in0.m_data.m_data[2].m_data[0] * in0.m_data.m_data[0].m_data[1] *
            in0.m_data.m_data[1].m_data[2] +
           in0.m_data.m_data[0].m_data[0] * in0.m_data.m_data[1].m_data[1] *
           in0.m_data.m_data[2].m_data[2] +
           in0.m_data.m_data[1].m_data[0] * in0.m_data.m_data[2].m_data[1] *
           in0.m_data.m_data[0].m_data[2]) -
          in0.m_data.m_data[2].m_data[1] * in0.m_data.m_data[0].m_data[0] *
          in0.m_data.m_data[1].m_data[2]) -
         in0.m_data.m_data[0].m_data[1] * in0.m_data.m_data[1].m_data[0] *
         in0.m_data.m_data[2].m_data[2]) -
         in0.m_data.m_data[1].m_data[1] * in0.m_data.m_data[2].m_data[0] *
         in0.m_data.m_data[0].m_data[2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_28[2] = 0;
  local_28[3] = 1;
  local_28[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_28[lVar3]] = afStack_c[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}